

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Skeleton_blocker_complex.h
# Opt level: O0

bool __thiscall
Gudhi::skeleton_blocker::
Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::contains_edges
          (Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits> *this,
          Simplex *sigma)

{
  Vertex_handle a;
  bool bVar1;
  reference pVVar2;
  _Self *__x;
  _Self local_48;
  _Rb_tree_const_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
  local_40;
  const_iterator j;
  _Self local_30;
  _Self local_28;
  const_iterator i;
  Simplex *sigma_local;
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits> *this_local;
  
  i._M_node = (_Base_ptr)sigma;
  local_28._M_node =
       (_Base_ptr)
       Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
       ::begin(sigma);
  while( true ) {
    local_30._M_node =
         (_Base_ptr)
         Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
         ::end(i._M_node);
    bVar1 = std::operator!=(&local_28,&local_30);
    if (!bVar1) {
      return true;
    }
    pVVar2 = std::
             _Rb_tree_const_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
             ::operator*(&local_28);
    j._M_node._4_4_ = pVVar2->vertex;
    bVar1 = contains_vertex(this,j._M_node._4_4_);
    if (!bVar1) break;
    local_40._M_node = local_28._M_node;
    while( true ) {
      __x = std::
            _Rb_tree_const_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
            ::operator++(&local_40);
      local_48._M_node =
           (_Base_ptr)
           Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
           ::end(i._M_node);
      bVar1 = std::operator!=(__x,&local_48);
      if (!bVar1) break;
      pVVar2 = std::
               _Rb_tree_const_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
               ::operator*(&local_28);
      a.vertex = pVVar2->vertex;
      pVVar2 = std::
               _Rb_tree_const_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
               ::operator*(&local_40);
      bVar1 = contains_edge(this,a,(Vertex_handle)pVVar2->vertex);
      if (!bVar1) {
        return false;
      }
    }
    std::
    _Rb_tree_const_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
    ::operator++(&local_28);
  }
  return false;
}

Assistant:

bool contains_edges(const Simplex & sigma) const {
    for (auto i = sigma.begin(); i != sigma.end(); ++i) {
      if (!contains_vertex(*i))
        return false;
      for (auto j = i; ++j != sigma.end();) {
        if (!contains_edge(*i, *j))
          return false;
      }
    }
    return true;
  }